

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_json_encode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined1 local_48 [8];
  SyBlob sBlob;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  sBlob._24_8_ = apArg;
  if (nArg < 1) {
    jx9_result_bool(pCtx,0);
  }
  else {
    SyBlobInit((SyBlob *)local_48,&pCtx->pVm->sAllocator);
    jx9JsonSerialize(*(jx9_value **)sBlob._24_8_,(SyBlob *)local_48);
    jx9_result_string(pCtx,(char *)sBlob.pAllocator,(int)sBlob.pBlob);
    SyBlobRelease((SyBlob *)local_48);
  }
  return 0;
}

Assistant:

static int vm_builtin_json_encode(jx9_context *pCtx,int nArg,jx9_value **apArg)
{
	SyBlob sBlob;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Init the working buffer */
	SyBlobInit(&sBlob,&pCtx->pVm->sAllocator);
	/* Perform the encoding operation */
	jx9JsonSerialize(apArg[0],&sBlob);
	/* Return the serialized value */
	jx9_result_string(pCtx,(const char *)SyBlobData(&sBlob),(int)SyBlobLength(&sBlob));
	/* Cleanup */
	SyBlobRelease(&sBlob);
	/* All done */
	return JX9_OK;
}